

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     sahf<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (uint8_t *ah,Context *context)

{
  (context->flags).sign_ = *ah & 0xffffff80;
  (context->flags).zero_ = (uint)((*ah & 0x40) == 0);
  (context->flags).auxiliary_carry_ = *ah & 0x10;
  (context->flags).parity_ = (uint)((*ah & 4) == 0);
  (context->flags).carry_ = *ah & 1;
  return;
}

Assistant:

void sahf(
	uint8_t &ah,
	ContextT &context
) {
	/*
		EFLAGS(SF:ZF:0:AF:0:PF:1:CF) ← AH;
	*/
	context.flags.template set_from<uint8_t, Flag::Sign>(ah);
	context.flags.template set_from<Flag::Zero>(!(ah & 0x40));
	context.flags.template set_from<Flag::AuxiliaryCarry>(ah & 0x10);
	context.flags.template set_from<Flag::ParityOdd>(!(ah & 0x04));
	context.flags.template set_from<Flag::Carry>(ah & 0x01);
}